

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::WriteCircle(ON_BinaryArchive *this,ON_Circle *circle)

{
  bool bVar1;
  ON_3dPoint local_30;
  
  bVar1 = WritePlane(this,&circle->plane);
  if (bVar1) {
    local_30.x = circle->radius;
    bVar1 = WriteDouble(this,1,&local_30.x);
  }
  if (bVar1 != false) {
    ON_Circle::PointAt(&local_30,circle,0.0);
    bVar1 = WriteDouble(this,3,&local_30.x);
  }
  if (bVar1 != false) {
    ON_Circle::PointAt(&local_30,circle,1.5707963267948966);
    bVar1 = WriteDouble(this,3,&local_30.x);
  }
  if (bVar1 != false) {
    ON_Circle::PointAt(&local_30,circle,3.141592653589793);
    bVar1 = WriteDouble(this,3,&local_30.x);
  }
  return bVar1;
}

Assistant:

bool 
ON_BinaryArchive::WriteCircle(const ON_Circle& circle)
{
  bool rc = WritePlane( circle.plane );
  if (rc)
    rc = WriteDouble( circle.radius );
  // m_point[] removed 2001, November, 7
  if (rc)
    rc = WritePoint( circle.PointAt(0.0) );
  if (rc)
    rc = WritePoint( circle.PointAt(0.5*ON_PI) );
  if (rc)
    rc = WritePoint( circle.PointAt(ON_PI) );
  /*
  if (rc)
    rc = WritePoint( circle.m_point[0] );
  if (rc)
    rc = WritePoint( circle.m_point[1] );
  if (rc)
    rc = WritePoint( circle.m_point[2] );
  */
  return rc;
}